

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# file_pool_impl.cpp
# Opt level: O1

void __thiscall
libtorrent::aux::file_pool_impl<libtorrent::aux::file_pool_entry>::release
          (file_pool_impl<libtorrent::aux::file_pool_entry> *this,storage_index_t st,
          file_index_t file_index)

{
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this_00;
  iterator x;
  incrementable_type nrv;
  unique_lock<std::mutex> l;
  impl_pointer xi;
  unique_lock<std::mutex> local_38;
  pair<libtorrent::aux::strong_typedef<unsigned_int,_libtorrent::storage_index_tag_t,_void>,_libtorrent::aux::strong_typedef<int,_libtorrent::aux::file_index_tag,_void>_>
  local_28;
  
  local_38._M_device = &this->m_mutex;
  local_38._M_owns = false;
  ::std::unique_lock<std::mutex>::lock(&local_38);
  local_38._M_owns = true;
  local_28.second.m_val = file_index.m_val;
  local_28.first.m_val = st.m_val;
  x = boost::multi_index::detail::
      ordered_index_impl<boost::multi_index::member<libtorrent::aux::file_pool_entry,std::pair<libtorrent::aux::strong_typedef<unsigned_int,libtorrent::storage_index_tag_t,void>,libtorrent::aux::strong_typedef<int,libtorrent::aux::file_index_tag,void>>,&libtorrent::aux::file_pool_entry::key>,std::less<std::pair<libtorrent::aux::strong_typedef<unsigned_int,libtorrent::storage_index_tag_t,void>,libtorrent::aux::strong_typedef<int,libtorrent::aux::file_index_tag,void>>>,boost::multi_index::detail::nth_layer<1,libtorrent::aux::file_pool_entry,boost::multi_index::indexed_by<boost::multi_index::ordered_unique<boost::multi_index::member<libtorrent::aux::file_pool_entry,std::pair<libtorrent::aux::strong_typedef<unsigned_int,libtorrent::storage_index_tag_t,void>,libtorrent::aux::strong_typedef<int,libtorrent::aux::file_index_tag,void>>,&libtorrent::aux::file_pool_entry::key>,mpl_::na,mpl_::na>,boost::multi_index::sequenced<boost::multi_index::tag<mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na>>,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na>,std::allocator<libtorrent::aux::file_pool_entry>>,boost::mpl::vector0<mpl_::na>,boost::multi_index::detail::ordered_unique_tag,boost::multi_index::detail::null_augment_policy>
      ::
      find<std::pair<libtorrent::aux::strong_typedef<unsigned_int,libtorrent::storage_index_tag_t,void>,libtorrent::aux::strong_typedef<int,libtorrent::aux::file_index_tag,void>>>
                ((ordered_index_impl<boost::multi_index::member<libtorrent::aux::file_pool_entry,std::pair<libtorrent::aux::strong_typedef<unsigned_int,libtorrent::storage_index_tag_t,void>,libtorrent::aux::strong_typedef<int,libtorrent::aux::file_index_tag,void>>,&libtorrent::aux::file_pool_entry::key>,std::less<std::pair<libtorrent::aux::strong_typedef<unsigned_int,libtorrent::storage_index_tag_t,void>,libtorrent::aux::strong_typedef<int,libtorrent::aux::file_index_tag,void>>>,boost::multi_index::detail::nth_layer<1,libtorrent::aux::file_pool_entry,boost::multi_index::indexed_by<boost::multi_index::ordered_unique<boost::multi_index::member<libtorrent::aux::file_pool_entry,std::pair<libtorrent::aux::strong_typedef<unsigned_int,libtorrent::storage_index_tag_t,void>,libtorrent::aux::strong_typedef<int,libtorrent::aux::file_index_tag,void>>,&libtorrent::aux::file_pool_entry::key>,mpl_::na,mpl_::na>,boost::multi_index::sequenced<boost::multi_index::tag<mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na>>,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na>,std::allocator<libtorrent::aux::file_pool_entry>>,boost::mpl::vector0<mpl_::na>,boost::multi_index::detail::ordered_unique_tag,boost::multi_index::detail::null_augment_policy>
                  *)&(this->m_files).super_type,&local_28);
  if (x.node != (this->m_files).
                super_header_holder<boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::sequenced_index_node<boost::multi_index::detail::index_node_base<libtorrent::aux::file_pool_entry,_std::allocator<libtorrent::aux::file_pool_entry>_>_>_>_*,_boost::multi_index::multi_index_container<libtorrent::aux::file_pool_entry,_boost::multi_index::indexed_by<boost::multi_index::ordered_unique<boost::multi_index::member<libtorrent::aux::file_pool_entry,_std::pair<libtorrent::aux::strong_typedef<unsigned_int,_libtorrent::storage_index_tag_t,_void>,_libtorrent::aux::strong_typedef<int,_libtorrent::aux::file_index_tag,_void>_>,_&libtorrent::aux::file_pool_entry::key>,_mpl_::na,_mpl_::na>,_boost::multi_index::sequenced<boost::multi_index::tag<mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na>_>,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na>,_std::allocator<libtorrent::aux::file_pool_entry>_>_>
                .member) {
    this_00 = *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)
               ((long)&((x.node)->
                       super_sequenced_index_node<boost::multi_index::detail::index_node_base<libtorrent::aux::file_pool_entry,_std::allocator<libtorrent::aux::file_pool_entry>_>_>
                       ).
                       super_index_node_base<libtorrent::aux::file_pool_entry,_std::allocator<libtorrent::aux::file_pool_entry>_>
                       .super_pod_value_holder<libtorrent::aux::file_pool_entry>.space.data_ + 0x10)
    ;
    if (this_00 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      if (__libc_single_threaded == '\0') {
        LOCK();
        this_00->_M_use_count = this_00->_M_use_count + 1;
        UNLOCK();
      }
      else {
        this_00->_M_use_count = this_00->_M_use_count + 1;
      }
    }
    local_28 = (pair<libtorrent::aux::strong_typedef<unsigned_int,_libtorrent::storage_index_tag_t,_void>,_libtorrent::aux::strong_typedef<int,_libtorrent::aux::file_index_tag,_void>_>
                )&(x.node)->
                  super_ordered_index_node_trampoline<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::sequenced_index_node<boost::multi_index::detail::index_node_base<libtorrent::aux::file_pool_entry,_std::allocator<libtorrent::aux::file_pool_entry>_>_>_>
    ;
    boost::multi_index::detail::
    ordered_index_node_impl<boost::multi_index::detail::null_augment_policy,_std::allocator<char>_>
    ::increment((pointer *)&local_28);
    boost::multi_index::
    multi_index_container<libtorrent::aux::file_pool_entry,_boost::multi_index::indexed_by<boost::multi_index::ordered_unique<boost::multi_index::member<libtorrent::aux::file_pool_entry,_std::pair<libtorrent::aux::strong_typedef<unsigned_int,_libtorrent::storage_index_tag_t,_void>,_libtorrent::aux::strong_typedef<int,_libtorrent::aux::file_index_tag,_void>_>,_&libtorrent::aux::file_pool_entry::key>,_mpl_::na,_mpl_::na>,_boost::multi_index::sequenced<boost::multi_index::tag<mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na>_>,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na>,_std::allocator<libtorrent::aux::file_pool_entry>_>
    ::erase_(&this->m_files,x.node);
    ::std::unique_lock<std::mutex>::unlock(&local_38);
    if (this_00 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_00);
    }
  }
  ::std::unique_lock<std::mutex>::~unique_lock(&local_38);
  return;
}

Assistant:

void file_pool_impl<FileEntry>::release(storage_index_t const st, file_index_t file_index)
	{
		std::unique_lock<std::mutex> l(m_mutex);

		auto& key_view = m_files. template get<0>();
		auto const i = key_view.find(file_id{st, file_index});
		if (i == key_view.end()) return;

		auto mapping = std::move(i->mapping);
		key_view.erase(i);

		// closing a file may take a long time (mac os x), so make sure
		// we're not holding the mutex
		l.unlock();
	}